

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O2

void qt_message_output(QtMsgType msgType,QMessageLogContext *context,QString *message)

{
  bool bVar1;
  int frameCount;
  long in_FS_OFFSET;
  QInternalMessageLogContext local_168;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_168.backtrace,0xaa,0x120);
  local_168.super_QMessageLogContext.version = 2;
  local_168.super_QMessageLogContext._4_8_ = 0;
  local_168.super_QMessageLogContext.file._4_4_ = 0;
  local_168.super_QMessageLogContext.function._0_4_ = 0;
  local_168.super_QMessageLogContext.function._4_4_ = 0;
  local_168.super_QMessageLogContext.category = (char *)0x0;
  local_168.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload.
  super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
  super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_engaged = false;
  frameCount = QInternalMessageLogContext::initFrom(&local_168,context);
  if (frameCount != 0) {
    QInternalMessageLogContext::populateBacktrace(&local_168,frameCount);
  }
  qt_message_print(msgType,&local_168.super_QMessageLogContext,message);
  bVar1 = isFatal(msgType);
  if (bVar1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      qAbort();
    }
  }
  else {
    std::_Optional_payload_base<QVarLengthArray<void_*,_32LL>_>::_M_reset
              ((_Optional_payload_base<QVarLengthArray<void_*,_32LL>_> *)&local_168.backtrace);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void qt_message_output(QtMsgType msgType, const QMessageLogContext &context, const QString &message)
{
    QInternalMessageLogContext ctx(context);
    qt_message_print(msgType, ctx, message);
    qt_maybe_message_fatal(msgType, ctx, message);
}